

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

DisasJumpType op_sck(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  TCGv_i64 val;
  TCGv_i64 addr;
  uint uVar1;
  TCGTemp *local_38;
  TCGv_i64 local_30;
  
  tcg_ctx = s->uc->tcg_ctx;
  val = o->in1;
  addr = o->addr1;
  uVar1 = get_mem_index(s);
  tcg_gen_qemu_ld_i64_s390x(tcg_ctx,val,addr,(ulong)uVar1,MO_ALIGN|MO_BEQ);
  local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_30 = o->in1 + (long)tcg_ctx;
  tcg_gen_callN_s390x(tcg_ctx,helper_sck,(TCGTemp *)(tcg_ctx->cc_op + (long)tcg_ctx),2,&local_38);
  set_cc_static(s);
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_sck(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    tcg_gen_qemu_ld_i64(tcg_ctx, o->in1, o->addr1, get_mem_index(s), MO_TEQ | MO_ALIGN);
    gen_helper_sck(tcg_ctx, tcg_ctx->cc_op, tcg_ctx->cpu_env, o->in1);
    set_cc_static(s);
    return DISAS_NEXT;
}